

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int lookupName(Parse *pParse,char *zDb,char *zTab,char *zCol,NameContext *pNC,Expr *pExpr)

{
  int *piVar1;
  ushort uVar2;
  sqlite3 *db;
  Db *pDVar3;
  SrcList *pSVar4;
  Table *pTVar5;
  Select *pSVar6;
  ExprList *pEVar7;
  IdList *pIVar8;
  ExprList_item *pEVar9;
  uint uVar10;
  bool bVar11;
  bool bVar12;
  int iVar13;
  uint uVar14;
  int iVar15;
  byte bVar16;
  long lVar17;
  ulong uVar18;
  char *pcVar19;
  SrcList_item *pSVar20;
  Table **ppTVar21;
  u8 uVar22;
  Table **ppTVar23;
  uint uVar24;
  uint uVar25;
  ulong uVar26;
  long lVar27;
  Column *pCVar28;
  int local_c4;
  int local_a8;
  SrcList_item *local_88;
  NameContext *local_80;
  Schema *local_78;
  int local_64;
  
  db = pParse->db;
  pExpr->iTable = -1;
  pExpr->pTab = (Table *)0x0;
  if (zDb == (char *)0x0) {
    local_78 = (Schema *)0x0;
  }
  else {
    uVar18 = (ulong)(uint)db->nDb;
    if (db->nDb < 1) {
      uVar18 = 0;
    }
    lVar27 = 0;
    do {
      lVar17 = lVar27;
      if (uVar18 * 0x20 + 0x20 == lVar17 + 0x20) {
        local_78 = (Schema *)0x0;
        goto LAB_0016e03a;
      }
      pDVar3 = db->aDb;
      iVar13 = sqlite3_stricmp(*(char **)((long)&pDVar3->zName + lVar17),zDb);
      lVar27 = lVar17 + 0x20;
    } while (iVar13 != 0);
    local_78 = *(Schema **)((long)&pDVar3->pSchema + lVar17);
  }
LAB_0016e03a:
  ppTVar23 = &pParse->pTriggerTab;
  bVar12 = false;
  local_88 = (SrcList_item *)0x0;
  local_64 = 0;
  local_a8 = 0;
  local_c4 = 0;
  local_80 = pNC;
LAB_0016e09b:
  if ((local_c4 == 0) && (local_80 != (NameContext *)0x0)) {
    pSVar4 = local_80->pSrcList;
    if (pSVar4 == (SrcList *)0x0) {
      local_c4 = 0;
    }
    else {
      uVar2 = pSVar4->nSrc;
      pSVar20 = pSVar4->a;
      local_c4 = 0;
      if ((short)uVar2 < 1) {
        uVar2 = 0;
      }
      for (uVar24 = 0; uVar24 != uVar2; uVar24 = uVar24 + 1) {
        pTVar5 = pSVar20->pTab;
        pSVar6 = pSVar20->pSelect;
        if ((pSVar6 == (Select *)0x0) || ((pSVar6->selFlags & 0x200) == 0)) {
LAB_0016e1b9:
          if ((zDb == (char *)0x0) || (pTVar5->pSchema == local_78)) {
            if (zTab != (char *)0x0) {
              pcVar19 = pSVar20->zAlias;
              if (pcVar19 == (char *)0x0) {
                pcVar19 = pTVar5->zName;
              }
              iVar13 = sqlite3_stricmp(pcVar19,zTab);
              if (iVar13 != 0) goto LAB_0016e2db;
            }
            if (local_a8 == 0) {
              local_88 = pSVar20;
            }
            local_a8 = local_a8 + 1;
            pCVar28 = pTVar5->aCol;
            uVar14 = (uint)(ushort)pTVar5->nCol;
            uVar25 = 0;
            if (pTVar5->nCol < 1) {
              uVar14 = 0;
            }
            for (; uVar25 != uVar14; uVar25 = uVar25 + 1) {
              iVar13 = sqlite3_stricmp(pCVar28->zName,zCol);
              if (iVar13 == 0) {
                if (local_c4 != 1) {
LAB_0016e2a0:
                  local_c4 = local_c4 + 1;
                  if (uVar25 == (int)pTVar5->iPKey) {
                    uVar25 = 0xffff;
                  }
                  pExpr->iColumn = (ynVar)uVar25;
                  local_88 = pSVar20;
                  break;
                }
                if ((pSVar20->jointype & 4) == 0) {
                  pIVar8 = pSVar20->pUsing;
                  if (pIVar8 == (IdList *)0x0) goto LAB_0016e2a0;
                  uVar10 = pIVar8->nId;
                  if (pIVar8->nId < 1) {
                    uVar10 = 0;
                  }
                  lVar27 = 0;
                  do {
                    if ((ulong)uVar10 * 0x10 + 0x10 == lVar27 + 0x10) goto LAB_0016e2a0;
                    iVar13 = sqlite3_stricmp(*(char **)((long)&pIVar8->a->zName + lVar27),zCol);
                    lVar27 = lVar27 + 0x10;
                  } while (iVar13 != 0);
                }
              }
              pCVar28 = pCVar28 + 1;
            }
          }
        }
        else {
          pEVar7 = pSVar6->pEList;
          uVar25 = pEVar7->nExpr;
          uVar26 = 0;
          uVar18 = (ulong)uVar25;
          if ((int)uVar25 < 1) {
            uVar18 = uVar26;
          }
          lVar27 = 0x10;
          bVar11 = false;
          for (; uVar18 != uVar26; uVar26 = uVar26 + 1) {
            iVar13 = sqlite3MatchSpanName
                               (*(char **)((long)&pEVar7->a->pExpr + lVar27),zCol,zTab,zDb);
            if (iVar13 != 0) {
              local_c4 = local_c4 + 1;
              pExpr->iColumn = (ynVar)uVar26;
              bVar11 = true;
              local_a8 = 2;
              local_88 = pSVar20;
            }
            lVar27 = lVar27 + 0x20;
          }
          if (!bVar11 && zTab != (char *)0x0) goto LAB_0016e1b9;
        }
LAB_0016e2db:
        pSVar20 = pSVar20 + 1;
      }
      if (local_88 == (SrcList_item *)0x0) {
        local_88 = (SrcList_item *)0x0;
      }
      else {
        pExpr->iTable = local_88->iCursor;
        pTVar5 = local_88->pTab;
        pExpr->pTab = pTVar5;
        local_78 = pTVar5->pSchema;
      }
    }
    if (local_c4 == 0 && (zTab != (char *)0x0 && zDb == (char *)0x0)) {
      pTVar5 = *ppTVar23;
      local_c4 = 0;
      if (pTVar5 == (Table *)0x0) goto LAB_0016e4a5;
      uVar22 = pParse->eTriggerOp;
      if (uVar22 == 'j') {
LAB_0016e3a1:
        iVar15 = sqlite3_stricmp("old",zTab);
        iVar13 = 0;
        if (iVar15 != 0) {
          local_c4 = 0;
          goto LAB_0016e4a5;
        }
        bVar11 = true;
      }
      else {
        iVar13 = sqlite3_stricmp("new",zTab);
        if (iVar13 != 0) {
          if (uVar22 == 'i') {
            local_c4 = 0;
            goto LAB_0016e4a5;
          }
          goto LAB_0016e3a1;
        }
        bVar11 = false;
        iVar13 = 1;
      }
      pExpr->iTable = iVar13;
      local_78 = pTVar5->pSchema;
      local_a8 = local_a8 + 1;
      uVar24 = (uint)pTVar5->nCol;
      uVar18 = 0;
      if (0 < pTVar5->nCol) {
        uVar18 = (ulong)uVar24;
      }
      lVar27 = 0;
      for (uVar26 = 0; uVar18 != uVar26; uVar26 = uVar26 + 1) {
        iVar13 = sqlite3_stricmp(*(char **)((long)&pTVar5->aCol->zName + lVar27),zCol);
        if (iVar13 == 0) {
          if ((long)pTVar5->iPKey == uVar26) {
            uVar26 = 0xffffffffffffffff;
          }
          uVar18 = uVar26 & 0xffffffff;
          uVar25 = (uint)uVar26;
          if ((int)uVar25 < (int)uVar24) goto LAB_0016e460;
          break;
        }
        lVar27 = lVar27 + 0x30;
      }
      iVar13 = sqlite3IsRowid(zCol);
      uVar25 = -(uint)(iVar13 != 0) | (uint)uVar18;
LAB_0016e460:
      if ((int)uVar24 <= (int)uVar25) goto LAB_0016e4a5;
      if ((int)uVar25 < 0) {
        pExpr->affinity = 'd';
      }
      else {
        uVar24 = 1 << ((byte)uVar25 & 0x1f);
        if (0x1f < uVar25) {
          uVar24 = 0xffffffff;
        }
        if (bVar11) {
          pParse->oldmask = pParse->oldmask | uVar24;
        }
        else {
          pParse->newmask = pParse->newmask | uVar24;
        }
      }
      pExpr->iColumn = (ynVar)uVar25;
      pExpr->pTab = pTVar5;
      bVar12 = true;
      local_c4 = 1;
    }
    else {
LAB_0016e4a5:
      if ((local_c4 == 0) && (local_a8 == 1)) {
        iVar13 = sqlite3IsRowid(zCol);
        if (iVar13 == 0) {
          local_c4 = 0;
          local_a8 = 1;
        }
        else {
          pExpr->iColumn = -1;
          pExpr->affinity = 'd';
          local_c4 = 1;
          local_a8 = 1;
        }
      }
    }
    if ((zTab == (char *)0x0) && (pEVar7 = local_80->pEList, pEVar7 != (ExprList *)0x0))
    goto code_r0x0016e540;
    goto LAB_0016e5ba;
  }
  if ((zTab == (char *)0x0) && (local_c4 == 0)) {
    if ((pExpr->flags & 0x40) != 0) {
      pExpr->op = '^';
      pExpr->pTab = (Table *)0x0;
      return 1;
    }
  }
  else if (local_c4 == 1) goto LAB_0016e707;
  pcVar19 = "ambiguous column name";
  if (local_c4 == 0) {
    pcVar19 = "no such column";
  }
  if (zDb == (char *)0x0) {
    if (zTab == (char *)0x0) {
      sqlite3ErrorMsg(pParse,"%s: %s",pcVar19,zCol);
    }
    else {
      sqlite3ErrorMsg(pParse,"%s: %s.%s",pcVar19,zTab,zCol);
    }
  }
  else {
    sqlite3ErrorMsg(pParse,"%s: %s.%s.%s",pcVar19,zDb,zTab,zCol);
  }
  pParse->checkSchema = '\x01';
  pNC->nErr = pNC->nErr + 1;
LAB_0016e707:
  uVar2 = pExpr->iColumn;
  if ((-1 < (short)uVar2) && (local_88 != (SrcList_item *)0x0)) {
    bVar16 = 0x3f;
    if (uVar2 < 0x3f) {
      bVar16 = (byte)uVar2;
    }
    local_88->colUsed = local_88->colUsed | 1L << (bVar16 & 0x3f);
  }
  sqlite3ExprDelete(db,pExpr->pLeft);
  pExpr->pLeft = (Expr *)0x0;
  sqlite3ExprDelete(db,pExpr->pRight);
  pExpr->pRight = (Expr *)0x0;
  uVar22 = '<';
  if (!bVar12) {
    uVar22 = 0x98;
  }
  pExpr->op = uVar22;
  if (local_c4 == 1) {
LAB_0016e77b:
    if (pParse->db->xAuth != (_func_int_void_ptr_int_char_ptr_char_ptr_char_ptr_char_ptr *)0x0) {
      pSVar4 = local_80->pSrcList;
      iVar13 = sqlite3SchemaToIndex(pParse->db,local_78);
      if (-1 < iVar13) {
        if (uVar22 != '<') {
          uVar24._0_2_ = pSVar4->nSrc;
          uVar24._2_2_ = pSVar4->nAlloc;
          uVar25 = 0;
          if (0 < (short)(undefined2)uVar24) {
            uVar25 = uVar24;
          }
          lVar27 = (ulong)(uVar25 & 0xffff) + 1;
          ppTVar21 = (Table **)&pSVar4[-1].a[0].pSelect;
          do {
            lVar27 = lVar27 + -1;
            if (lVar27 == 0) goto LAB_0016e832;
            ppTVar23 = ppTVar21 + 0xd;
            piVar1 = (int *)((long)ppTVar21 + 0x84);
            ppTVar21 = ppTVar23;
          } while (pExpr->iTable != *piVar1);
        }
        pTVar5 = *ppTVar23;
        if (pTVar5 != (Table *)0x0) {
          lVar27 = (long)pExpr->iColumn;
          if ((pExpr->iColumn < 0) && (lVar27 = (long)pTVar5->iPKey, lVar27 < 0)) {
            pcVar19 = "ROWID";
          }
          else {
            pcVar19 = pTVar5->aCol[lVar27].zName;
          }
          iVar13 = sqlite3AuthReadCol(pParse,pTVar5->zName,pcVar19,iVar13);
          if (iVar13 == 2) {
            pExpr->op = 'b';
          }
        }
      }
    }
LAB_0016e832:
    iVar13 = 1;
    for (; pNC->nRef = pNC->nRef + 1, pNC != local_80; pNC = pNC->pNext) {
    }
  }
  else {
LAB_0016e849:
    iVar13 = 2;
  }
  return iVar13;
code_r0x0016e540:
  bVar16 = local_80->ncFlags;
  if ((local_c4 == 0) || ((bVar16 & 0x10) == 0)) {
    uVar24 = pEVar7->nExpr;
    if (pEVar7->nExpr < 1) {
      uVar24 = 0;
    }
    lVar27 = 8;
    for (uVar18 = 0; uVar24 != uVar18; uVar18 = uVar18 + 1) {
      pEVar9 = pEVar7->a;
      pcVar19 = *(char **)((long)&pEVar9->pExpr + lVar27);
      if ((pcVar19 != (char *)0x0) && (iVar13 = sqlite3_stricmp(pcVar19,zCol), iVar13 == 0)) {
        if (((bVar16 & 1) == 0) && ((*(byte *)(*(long *)((long)pEVar9 + lVar27 + -8) + 2) & 2) != 0)
           ) {
          sqlite3ErrorMsg(pParse,"misuse of aliased aggregate %s",pcVar19);
          goto LAB_0016e849;
        }
        resolveAlias(pParse,pEVar7,(int)uVar18,pExpr,"",local_64);
        uVar22 = pExpr->op;
        if (uVar22 != '\x18') goto LAB_0016e77b;
        goto LAB_0016e832;
      }
      lVar27 = lVar27 + 0x20;
    }
LAB_0016e5ba:
    if (local_c4 == 0) {
      local_80 = local_80->pNext;
      local_64 = local_64 + 1;
    }
  }
  goto LAB_0016e09b;
}

Assistant:

static int lookupName(
  Parse *pParse,       /* The parsing context */
  const char *zDb,     /* Name of the database containing table, or NULL */
  const char *zTab,    /* Name of table containing column, or NULL */
  const char *zCol,    /* Name of the column. */
  NameContext *pNC,    /* The name context used to resolve the name */
  Expr *pExpr          /* Make this EXPR node point to the selected column */
){
  int i, j;                         /* Loop counters */
  int cnt = 0;                      /* Number of matching column names */
  int cntTab = 0;                   /* Number of matching table names */
  int nSubquery = 0;                /* How many levels of subquery */
  sqlite3 *db = pParse->db;         /* The database connection */
  struct SrcList_item *pItem;       /* Use for looping over pSrcList items */
  struct SrcList_item *pMatch = 0;  /* The matching pSrcList item */
  NameContext *pTopNC = pNC;        /* First namecontext in the list */
  Schema *pSchema = 0;              /* Schema of the expression */
  int isTrigger = 0;

  assert( pNC );     /* the name context cannot be NULL. */
  assert( zCol );    /* The Z in X.Y.Z cannot be NULL */
  assert( !ExprHasAnyProperty(pExpr, EP_TokenOnly|EP_Reduced) );

  /* Initialize the node to no-match */
  pExpr->iTable = -1;
  pExpr->pTab = 0;
  ExprSetIrreducible(pExpr);

  /* Translate the schema name in zDb into a pointer to the corresponding
  ** schema.  If not found, pSchema will remain NULL and nothing will match
  ** resulting in an appropriate error message toward the end of this routine
  */
  if( zDb ){
    for(i=0; i<db->nDb; i++){
      assert( db->aDb[i].zName );
      if( sqlite3StrICmp(db->aDb[i].zName,zDb)==0 ){
        pSchema = db->aDb[i].pSchema;
        break;
      }
    }
  }

  /* Start at the inner-most context and move outward until a match is found */
  while( pNC && cnt==0 ){
    ExprList *pEList;
    SrcList *pSrcList = pNC->pSrcList;

    if( pSrcList ){
      for(i=0, pItem=pSrcList->a; i<pSrcList->nSrc; i++, pItem++){
        Table *pTab;
        Column *pCol;
  
        pTab = pItem->pTab;
        assert( pTab!=0 && pTab->zName!=0 );
        assert( pTab->nCol>0 );
        if( pItem->pSelect && (pItem->pSelect->selFlags & SF_NestedFrom)!=0 ){
          int hit = 0;
          pEList = pItem->pSelect->pEList;
          for(j=0; j<pEList->nExpr; j++){
            if( sqlite3MatchSpanName(pEList->a[j].zSpan, zCol, zTab, zDb) ){
              cnt++;
              cntTab = 2;
              pMatch = pItem;
              pExpr->iColumn = j;
              hit = 1;
            }
          }
          if( hit || zTab==0 ) continue;
        }
        if( zDb && pTab->pSchema!=pSchema ){
          continue;
        }
        if( zTab ){
          const char *zTabName = pItem->zAlias ? pItem->zAlias : pTab->zName;
          assert( zTabName!=0 );
          if( sqlite3StrICmp(zTabName, zTab)!=0 ){
            continue;
          }
        }
        if( 0==(cntTab++) ){
          pMatch = pItem;
        }
        for(j=0, pCol=pTab->aCol; j<pTab->nCol; j++, pCol++){
          if( sqlite3StrICmp(pCol->zName, zCol)==0 ){
            /* If there has been exactly one prior match and this match
            ** is for the right-hand table of a NATURAL JOIN or is in a 
            ** USING clause, then skip this match.
            */
            if( cnt==1 ){
              if( pItem->jointype & JT_NATURAL ) continue;
              if( nameInUsingClause(pItem->pUsing, zCol) ) continue;
            }
            cnt++;
            pMatch = pItem;
            /* Substitute the rowid (column -1) for the INTEGER PRIMARY KEY */
            pExpr->iColumn = j==pTab->iPKey ? -1 : (i16)j;
            break;
          }
        }
      }
      if( pMatch ){
        pExpr->iTable = pMatch->iCursor;
        pExpr->pTab = pMatch->pTab;
        pSchema = pExpr->pTab->pSchema;
      }
    } /* if( pSrcList ) */

#ifndef SQLITE_OMIT_TRIGGER
    /* If we have not already resolved the name, then maybe 
    ** it is a new.* or old.* trigger argument reference
    */
    if( zDb==0 && zTab!=0 && cnt==0 && pParse->pTriggerTab!=0 ){
      int op = pParse->eTriggerOp;
      Table *pTab = 0;
      assert( op==TK_DELETE || op==TK_UPDATE || op==TK_INSERT );
      if( op!=TK_DELETE && sqlite3StrICmp("new",zTab) == 0 ){
        pExpr->iTable = 1;
        pTab = pParse->pTriggerTab;
      }else if( op!=TK_INSERT && sqlite3StrICmp("old",zTab)==0 ){
        pExpr->iTable = 0;
        pTab = pParse->pTriggerTab;
      }

      if( pTab ){ 
        int iCol;
        pSchema = pTab->pSchema;
        cntTab++;
        for(iCol=0; iCol<pTab->nCol; iCol++){
          Column *pCol = &pTab->aCol[iCol];
          if( sqlite3StrICmp(pCol->zName, zCol)==0 ){
            if( iCol==pTab->iPKey ){
              iCol = -1;
            }
            break;
          }
        }
        if( iCol>=pTab->nCol && sqlite3IsRowid(zCol) ){
          iCol = -1;        /* IMP: R-44911-55124 */
        }
        if( iCol<pTab->nCol ){
          cnt++;
          if( iCol<0 ){
            pExpr->affinity = SQLITE_AFF_INTEGER;
          }else if( pExpr->iTable==0 ){
            testcase( iCol==31 );
            testcase( iCol==32 );
            pParse->oldmask |= (iCol>=32 ? 0xffffffff : (((u32)1)<<iCol));
          }else{
            testcase( iCol==31 );
            testcase( iCol==32 );
            pParse->newmask |= (iCol>=32 ? 0xffffffff : (((u32)1)<<iCol));
          }
          pExpr->iColumn = (i16)iCol;
          pExpr->pTab = pTab;
          isTrigger = 1;
        }
      }
    }
#endif /* !defined(SQLITE_OMIT_TRIGGER) */

    /*
    ** Perhaps the name is a reference to the ROWID
    */
    if( cnt==0 && cntTab==1 && sqlite3IsRowid(zCol) ){
      cnt = 1;
      pExpr->iColumn = -1;     /* IMP: R-44911-55124 */
      pExpr->affinity = SQLITE_AFF_INTEGER;
    }

    /*
    ** If the input is of the form Z (not Y.Z or X.Y.Z) then the name Z
    ** might refer to an result-set alias.  This happens, for example, when
    ** we are resolving names in the WHERE clause of the following command:
    **
    **     SELECT a+b AS x FROM table WHERE x<10;
    **
    ** In cases like this, replace pExpr with a copy of the expression that
    ** forms the result set entry ("a+b" in the example) and return immediately.
    ** Note that the expression in the result set should have already been
    ** resolved by the time the WHERE clause is resolved.
    */
    if( (pEList = pNC->pEList)!=0
     && zTab==0
     && ((pNC->ncFlags & NC_AsMaybe)==0 || cnt==0)
    ){
      for(j=0; j<pEList->nExpr; j++){
        char *zAs = pEList->a[j].zName;
        if( zAs!=0 && sqlite3StrICmp(zAs, zCol)==0 ){
          Expr *pOrig;
          assert( pExpr->pLeft==0 && pExpr->pRight==0 );
          assert( pExpr->x.pList==0 );
          assert( pExpr->x.pSelect==0 );
          pOrig = pEList->a[j].pExpr;
          if( (pNC->ncFlags&NC_AllowAgg)==0 && ExprHasProperty(pOrig, EP_Agg) ){
            sqlite3ErrorMsg(pParse, "misuse of aliased aggregate %s", zAs);
            return WRC_Abort;
          }
          resolveAlias(pParse, pEList, j, pExpr, "", nSubquery);
          cnt = 1;
          pMatch = 0;
          assert( zTab==0 && zDb==0 );
          goto lookupname_end;
        }
      } 
    }

    /* Advance to the next name context.  The loop will exit when either
    ** we have a match (cnt>0) or when we run out of name contexts.
    */
    if( cnt==0 ){
      pNC = pNC->pNext;
      nSubquery++;
    }
  }

  /*
  ** If X and Y are NULL (in other words if only the column name Z is
  ** supplied) and the value of Z is enclosed in double-quotes, then
  ** Z is a string literal if it doesn't match any column names.  In that
  ** case, we need to return right away and not make any changes to
  ** pExpr.
  **
  ** Because no reference was made to outer contexts, the pNC->nRef
  ** fields are not changed in any context.
  */
  if( cnt==0 && zTab==0 && ExprHasProperty(pExpr,EP_DblQuoted) ){
    pExpr->op = TK_STRING;
    pExpr->pTab = 0;
    return WRC_Prune;
  }

  /*
  ** cnt==0 means there was not match.  cnt>1 means there were two or
  ** more matches.  Either way, we have an error.
  */
  if( cnt!=1 ){
    const char *zErr;
    zErr = cnt==0 ? "no such column" : "ambiguous column name";
    if( zDb ){
      sqlite3ErrorMsg(pParse, "%s: %s.%s.%s", zErr, zDb, zTab, zCol);
    }else if( zTab ){
      sqlite3ErrorMsg(pParse, "%s: %s.%s", zErr, zTab, zCol);
    }else{
      sqlite3ErrorMsg(pParse, "%s: %s", zErr, zCol);
    }
    pParse->checkSchema = 1;
    pTopNC->nErr++;
  }

  /* If a column from a table in pSrcList is referenced, then record
  ** this fact in the pSrcList.a[].colUsed bitmask.  Column 0 causes
  ** bit 0 to be set.  Column 1 sets bit 1.  And so forth.  If the
  ** column number is greater than the number of bits in the bitmask
  ** then set the high-order bit of the bitmask.
  */
  if( pExpr->iColumn>=0 && pMatch!=0 ){
    int n = pExpr->iColumn;
    testcase( n==BMS-1 );
    if( n>=BMS ){
      n = BMS-1;
    }
    assert( pMatch->iCursor==pExpr->iTable );
    pMatch->colUsed |= ((Bitmask)1)<<n;
  }

  /* Clean up and return
  */
  sqlite3ExprDelete(db, pExpr->pLeft);
  pExpr->pLeft = 0;
  sqlite3ExprDelete(db, pExpr->pRight);
  pExpr->pRight = 0;
  pExpr->op = (isTrigger ? TK_TRIGGER : TK_COLUMN);
lookupname_end:
  if( cnt==1 ){
    assert( pNC!=0 );
    if( pExpr->op!=TK_AS ){
      sqlite3AuthRead(pParse, pExpr, pSchema, pNC->pSrcList);
    }
    /* Increment the nRef value on all name contexts from TopNC up to
    ** the point where the name matched. */
    for(;;){
      assert( pTopNC!=0 );
      pTopNC->nRef++;
      if( pTopNC==pNC ) break;
      pTopNC = pTopNC->pNext;
    }
    return WRC_Prune;
  } else {
    return WRC_Abort;
  }
}